

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_queue_entry.cpp
# Opt level: O0

int __thiscall libtorrent::aux::bw_request::assign_bandwidth(bw_request *this)

{
  int iVar1;
  int iVar2;
  value_type *ppbVar3;
  int *piVar4;
  bool bVar5;
  int local_28;
  int local_24;
  int j_1;
  int local_1c;
  int j;
  int quota;
  bw_request *this_local;
  
  local_1c = this->request_size - this->assigned;
  this->ttl = this->ttl + -1;
  this_local._4_4_ = local_1c;
  if (local_1c != 0) {
    j_1 = 0;
    _j = this;
    while( true ) {
      bVar5 = false;
      if (j_1 < 5) {
        ppbVar3 = container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                  ::operator[](&this->channel,(long)j_1);
        bVar5 = *ppbVar3 != (value_type)0x0;
      }
      if (!bVar5) break;
      ppbVar3 = container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                ::operator[](&this->channel,(long)j_1);
      iVar2 = bandwidth_channel::throttle(*ppbVar3);
      if ((iVar2 != 0) &&
         (ppbVar3 = container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                    ::operator[](&this->channel,(long)j_1), (*ppbVar3)->tmp != 0)) {
        ppbVar3 = container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                  ::operator[](&this->channel,(long)j_1);
        iVar2 = (*ppbVar3)->distribute_quota;
        iVar1 = this->priority;
        ppbVar3 = container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                  ::operator[](&this->channel,(long)j_1);
        local_24 = (int)(((long)iVar2 * (long)iVar1) / (long)(*ppbVar3)->tmp);
        piVar4 = ::std::min<int>(&local_24,&local_1c);
        local_1c = *piVar4;
      }
      j_1 = j_1 + 1;
    }
    this->assigned = local_1c + this->assigned;
    local_28 = 0;
    while( true ) {
      bVar5 = false;
      if (local_28 < 5) {
        ppbVar3 = container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                  ::operator[](&this->channel,(long)local_28);
        bVar5 = *ppbVar3 != (value_type)0x0;
      }
      if (!bVar5) break;
      ppbVar3 = container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                ::operator[](&this->channel,(long)local_28);
      bandwidth_channel::use_quota(*ppbVar3,local_1c);
      local_28 = local_28 + 1;
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

int bw_request::assign_bandwidth()
	{
		TORRENT_ASSERT(assigned < request_size);
		int quota = request_size - assigned;
		TORRENT_ASSERT(quota >= 0);
		--ttl;
		if (quota == 0) return quota;

		for (int j = 0; j < 5 && channel[j]; ++j)
		{
			if (channel[j]->throttle() == 0) continue;
			if (channel[j]->tmp == 0) continue;
			quota = std::min(int(std::int64_t(channel[j]->distribute_quota)
				* priority / channel[j]->tmp), quota);
		}
		assigned += quota;
		for (int j = 0; j < 5 && channel[j]; ++j)
			channel[j]->use_quota(quota);
		TORRENT_ASSERT(assigned <= request_size);
		return quota;
	}